

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTHumidityHTU21D.cpp
# Opt level: O0

bool __thiscall RTHumidityHTU21D::processBackground(RTHumidityHTU21D *this)

{
  bool bVar1;
  uint64_t uVar2;
  bool expired;
  uint64_t now;
  RTHumidityHTU21D *pRStack_18;
  uchar rawData [3];
  RTHumidityHTU21D *this_local;
  
  pRStack_18 = this;
  uVar2 = RTMath::currentUSecsSinceEpoch();
  if (uVar2 - this->m_startTime < 100000) {
    return true;
  }
  switch(this->m_state) {
  case 0:
    this->m_state = 1;
    this->m_startTime = uVar2;
    break;
  case 1:
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                               this->m_humidityAddr,0xf3,'\0',(uchar *)0x0,
                               "Failed to start HTU21D temp conv");
    if (!bVar1) {
      return false;
    }
    this->m_state = 2;
    this->m_startTime = uVar2;
    break;
  case 2:
    bVar1 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                              this->m_humidityAddr,'\x03',(uchar *)((long)&now + 5),
                              "Failed to read HTU21D temperature");
    if (!bVar1) {
      return false;
    }
    this->m_temperature =
         ((float)(CONCAT11(now._5_1_,now._6_1_) & 0xfffc) * 175.72) / 65536.0 + -46.85;
    this->m_temperatureValid = true;
    now._6_1_ = now._6_1_ & 0xfc;
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                               this->m_humidityAddr,0xf5,'\0',(uchar *)0x0,
                               "Failed to start HTU21D humidity conv");
    if (!bVar1) {
      return false;
    }
    this->m_state = 3;
    this->m_startTime = uVar2;
    break;
  case 3:
    bVar1 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                              this->m_humidityAddr,'\x03',(uchar *)((long)&now + 5),
                              "Failed to read HTU21D humidity");
    if (!bVar1) {
      return false;
    }
    this->m_humidity = ((float)(CONCAT11(now._5_1_,now._6_1_) & 0xfffc) * 125.0) / 65536.0 + -6.0;
    this->m_humidity = (25.0 - this->m_temperature) * -0.15 + this->m_humidity;
    this->m_humidityValid = true;
    this->m_state = 1;
    this->m_startTime = uVar2;
  }
  return true;
}

Assistant:

bool RTHumidityHTU21D:: processBackground()
{
    unsigned char rawData[3];
    uint64_t now = RTMath::currentUSecsSinceEpoch();
    bool expired = (now - m_startTime) >= HTU21D_STATE_INTERVAL;

    if (!expired)
        return true;

    switch (m_state) {
    case HTU21D_STATE_IN_RESET:
        m_state = HTU21D_STATE_IDLE;
        m_startTime = now;
        break;

    case HTU21D_STATE_IDLE:
        // start a temperature conversion
        if (!m_settings->HALWrite(m_humidityAddr, HTU21D_CMD_TRIG_TEMP, 0, NULL, "Failed to start HTU21D temp conv"))
            return false;
        m_state = HTU21D_STATE_TEMP_REQ;
        m_startTime = now;
        break;

    case HTU21D_STATE_TEMP_REQ:
        // read temp data
        if (!m_settings->HALRead(m_humidityAddr, 3, rawData, "Failed to read HTU21D temperature"))
            return false;
        // remove status bits
        rawData[1] &= 0xfc;
        m_temperature = -46.85 + 175.72 * (RTFLOAT)((((uint16_t)rawData[0]) << 8) | (uint16_t)rawData[1]) / 65536.0;
        m_temperatureValid = true;

        // start humidity conversion
        if (!m_settings->HALWrite(m_humidityAddr, HTU21D_CMD_TRIG_HUM, 0, NULL, "Failed to start HTU21D humidity conv"))
            return false;
        m_state = HTU21D_STATE_HUM_REQ;
        m_startTime = now;
        break;

    case HTU21D_STATE_HUM_REQ:
        // read humidity data
        if (!m_settings->HALRead(m_humidityAddr, 3, rawData, "Failed to read HTU21D humidity"))
            return false;
        // remove status bits
        rawData[1] &= 0xfc;
        m_humidity = -6.0 + 125.0 * (RTFLOAT)((((uint16_t)rawData[0]) << 8) | (uint16_t)rawData[1]) / 65536.0;
        // do temp compensation
        m_humidity += (25.0 - m_temperature) * -0.15;
        m_humidityValid = true;
        m_state = HTU21D_STATE_IDLE;
        m_startTime = now;
        break;
    }
    return true;
}